

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O3

QColor __thiscall QFusionStylePrivate::outline(QFusionStylePrivate *this,QPalette *pal)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  QColor QVar6;
  
  plVar1 = (long *)QPalette::brush((ColorGroup)pal,Dark);
  if (*(int *)(*plVar1 + 4) == 0x18) {
    uVar2 = 0xa0a000000001;
    uVar4 = 0;
  }
  else {
    puVar3 = (undefined8 *)QPalette::brush((ColorGroup)pal,Dark);
    auVar5 = QColor::darker((int)*puVar3 + 8);
    uVar2 = auVar5._0_8_;
    uVar4 = auVar5._8_8_ & 0xffffffffffff;
  }
  QVar6._8_8_ = uVar4;
  QVar6._0_8_ = uVar2;
  return QVar6;
}

Assistant:

QColor outline(const QPalette &pal) const {
        if (pal.window().style() == Qt::TexturePattern)
            return QColor(0, 0, 0, 160);
        return pal.window().color().darker(140);
    }